

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_library_init.c
# Opt level: O2

int ares_library_init_mem
              (int flags,_func_void_ptr_size_t *amalloc,_func_void_void_ptr *afree,
              _func_void_ptr_void_ptr_size_t *arealloc)

{
  if (amalloc != (_func_void_ptr_size_t *)0x0) {
    __ares_malloc = amalloc;
  }
  if (arealloc != (_func_void_ptr_void_ptr_size_t *)0x0) {
    __ares_realloc = arealloc;
  }
  if (afree != (_func_void_void_ptr *)0x0) {
    __ares_free = afree;
  }
  ares_initialized = ares_initialized + 1;
  return 0;
}

Assistant:

int ares_library_init_mem(int flags, void *(*amalloc)(size_t size),
                          void (*afree)(void *ptr),
                          void *(*arealloc)(void *ptr, size_t size))
{
  if (amalloc) {
    __ares_malloc = amalloc;
  }
  if (arealloc) {
    __ares_realloc = arealloc;
  }
  if (afree) {
    __ares_free = afree;
  }
  return ares_library_init(flags);
}